

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O1

char * flatcc_json_parser_int16(flatcc_json_parser_t *ctx,char *buf,char *end,int16_t *v)

{
  char *pcVar1;
  int err;
  int value_sign;
  uint64_t value;
  int local_2c;
  uint64_t local_28;
  
  local_28 = 0;
  local_2c = 0;
  *v = 0;
  if (buf == end) {
    return buf;
  }
  pcVar1 = flatcc_json_parser_integer(ctx,buf,end,&local_2c,&local_28);
  if (pcVar1 == buf) {
    return pcVar1;
  }
  if (local_2c == 0) {
    if (local_28 < 0x8000) goto LAB_0010f6d4;
    err = 7;
  }
  else {
    if (local_28 < 0x8001) {
      local_28 = -local_28;
LAB_0010f6d4:
      *v = (int16_t)local_28;
      return pcVar1;
    }
    err = 8;
  }
  pcVar1 = flatcc_json_parser_set_error(ctx,pcVar1,end,err);
  return pcVar1;
}

Assistant:

static inline const char *flatcc_json_parser_bool(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t *v)
{
    const char *k;
    uint8_t tmp;

    k = buf;
    if (end - buf >= 4 && memcmp(buf, "true", 4) == 0) {
        *v = 1;
        return k + 4;
    } else if (end - buf >= 5 && memcmp(buf, "false", 5) == 0) {
        *v = 0;
        return k + 5;
    }
    buf = flatcc_json_parser_uint8(ctx, buf, end, &tmp);
    *v = !!tmp;
    return buf;
}